

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture1D *pTVar1;
  float fVar2;
  IVec2 local_10;
  
  fVar2 = c->in[0].m_data[3];
  local_10.m_data[0] = (p->offset).m_data[0];
  pTVar1 = c->textures[0].tex1D;
  local_10.m_data[1] = 0;
  fVar2 = tcu::sampleLevelArray1DCompare
                    ((pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler,
                     c->in[0].m_data[2] / fVar2,c->in[0].m_data[0] / fVar2,p->lod,&local_10);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

static void		evalTexture1DShadowProjOffset		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), p.lod, p.offset.x()); }